

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O1

void disas_adda(CPUM68KState_conflict *env,DisasContext_conflict2 *s,uint16_t insn)

{
  TCGContext_conflict2 *tcg_ctx;
  uintptr_t o;
  TCGv_i32 pTVar1;
  TCGv_i32 *ppTVar2;
  uint uVar3;
  
  tcg_ctx = s->uc->tcg_ctx;
  pTVar1 = gen_ea_mode(env,s,insn >> 3 & 7,insn & 7,((insn >> 8 & 1) != 0) + 1,tcg_ctx->NULL_QREG,
                       (TCGv_i32 *)0x0,EA_LOADS,(uint)((((s->base).tb)->flags >> 0xd & 1) == 0));
  if (pTVar1 != tcg_ctx->NULL_QREG) {
    uVar3 = insn >> 9 & 7;
    if (((uint)s->writeback_mask >> uVar3 & 1) == 0) {
      ppTVar2 = s->uc->tcg_ctx->cpu_aregs;
    }
    else {
      ppTVar2 = s->writeback;
    }
    tcg_gen_op3_m68k(tcg_ctx,INDEX_op_add_i32,(TCGArg)(ppTVar2[uVar3] + (long)tcg_ctx),
                     (TCGArg)(ppTVar2[uVar3] + (long)tcg_ctx),(TCGArg)(pTVar1 + (long)tcg_ctx));
    return;
  }
  gen_exception(s,(s->base).pc_next,3);
  return;
}

Assistant:

DISAS_INSN(adda)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    TCGv src;
    TCGv reg;

    SRC_EA(env, src, (insn & 0x100) ? OS_LONG : OS_WORD, 1, NULL);
    reg = AREG(insn, 9);
    tcg_gen_add_i32(tcg_ctx, reg, reg, src);
}